

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void utf::testUtf8Encode(void)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  utf32_t c_2;
  size_t i_1;
  utf32_t c_1;
  size_t i;
  uint64_t time;
  utf32_t c;
  anon_union_4_2_43ac0e16 utf8 [2];
  int local_34;
  ulong local_30;
  int local_24;
  ulong local_20;
  int local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  printf("verifying...\n");
  for (local_c = 0; local_c < 0x200000; local_c = local_c + 1) {
    local_8 = 0;
    local_4 = 0;
    encodeCodePoint((utf8_t *)&local_8,local_c);
    encodeCodePoint_old((utf8_t *)&local_4,local_c);
    g_v = local_4;
  }
  printf("done\n");
  printf("original...");
  uVar1 = axl::sys::getPreciseTimestamp();
  for (local_20 = 0; local_20 < 500000; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 0x800; local_24 = local_24 + 1) {
      local_8 = 0;
      encodeCodePoint_old((utf8_t *)&local_8,local_24);
      g_v = local_8;
    }
  }
  uVar2 = axl::sys::getPreciseTimestamp();
  lVar3 = uVar2 - uVar1;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  printf("done, %.3f sec\n",
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 10000000.0);
  printf("new........");
  uVar1 = axl::sys::getPreciseTimestamp();
  for (local_30 = 0; local_30 < 500000; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 0x800; local_34 = local_34 + 1) {
      local_8 = 0;
      encodeCodePoint((utf8_t *)&local_8,local_34);
      g_v = local_8;
    }
  }
  uVar2 = axl::sys::getPreciseTimestamp();
  lVar3 = uVar2 - uVar1;
  auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar5._0_8_ = lVar3;
  auVar5._12_4_ = 0x45300000;
  printf("done, %.3f sec\n",
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 10000000.0);
  return;
}

Assistant:

void
testUtf8Encode() {
	union {
		utf8_t m_c[4];
		uint32_t m_x;
	} utf8[2];

	printf("verifying...\n");

	for (utf32_t c = 0; c < 0x200000; c++) {
		utf8[0].m_x = 0;
		utf8[1].m_x = 0;

		encodeCodePoint(utf8[0].m_c, c);
		encodeCodePoint_old(utf8[1].m_c, c);
		ASSERT(utf8[0].m_x == utf8[1].m_x);
		g_v = utf8[0].m_x;
		g_v = utf8[1].m_x;
	}

	printf("done\n");

	enum {
//		LoopCount = 500,
//		MaxChar   = 0x200000,

//		LoopCount = 5000,
//		MaxChar   = 0x10000,

		LoopCount = 500000,
		MaxChar   = 0x800,
	};

	printf("original...");

	uint64_t time = sys::getPreciseTimestamp();

	for (size_t i = 0; i < LoopCount; i++)
		for (utf32_t c = 0; c < MaxChar; c++) {
			utf8[0].m_x = 0;
			encodeCodePoint_old(utf8[0].m_c, c);
			g_v = utf8[0].m_x;
		}

	time = sys::getPreciseTimestamp() - time;

	printf("done, %.3f sec\n", (double)time / 10000000);

	printf("new........");

	time = sys::getPreciseTimestamp();

	for (size_t i = 0; i < LoopCount; i++)
		for (utf32_t c = 0; c < MaxChar; c++) {
			utf8[0].m_x = 0;
			encodeCodePoint(utf8[0].m_c, c);
			g_v = utf8[0].m_x;
		}

	time = sys::getPreciseTimestamp() - time;

	printf("done, %.3f sec\n", (double)time / 10000000);
}